

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void processServiceResponse
               (ResponseDescription *rd,UA_SecureChannel *channel,UA_MessageType messageType,
               UA_UInt32 requestId,UA_ByteString *message)

{
  void *pvVar1;
  UA_Logger logger;
  UA_Boolean UVar2;
  char *pcVar3;
  undefined1 local_90 [8];
  UA_NodeId responseId;
  size_t offset;
  UA_TcpErrorMessage *msg;
  UA_ResponseHeader *respHeader;
  UA_NodeId serviceFaultNodeId;
  UA_NodeId expectedNodeId;
  UA_StatusCode retval;
  UA_ByteString *message_local;
  UA_UInt32 requestId_local;
  UA_MessageType messageType_local;
  UA_SecureChannel *channel_local;
  ResponseDescription *rd_local;
  
  UA_NODEID_NUMERIC((UA_NodeId *)((long)&serviceFaultNodeId.identifier + 8),0,
                    (uint)rd->responseType->binaryEncodingId);
  UA_NODEID_NUMERIC((UA_NodeId *)&respHeader,0,0x18d);
  pvVar1 = rd->response;
  rd->processed = true;
  if (messageType == UA_MESSAGETYPE_ERR) {
    logger = (rd->client->config).logger;
    pcVar3 = UA_StatusCode_name((UA_StatusCode)message->length);
    UA_LOG_ERROR(logger,UA_LOGCATEGORY_CLIENT,"Server replied with an error message: %s %.*s",pcVar3
                 ,message->data,message[1].length);
    expectedNodeId.identifier._12_4_ = (undefined4)message->length;
  }
  else if (messageType == UA_MESSAGETYPE_MSG) {
    if (requestId == rd->requestId) {
      responseId.identifier.string.data = (UA_Byte *)0x0;
      expectedNodeId.identifier._12_4_ =
           UA_NodeId_decodeBinary
                     (message,(size_t *)responseId.identifier.guid.data4,(UA_NodeId *)local_90);
      if (expectedNodeId.identifier._12_4_ == 0) {
        UVar2 = UA_NodeId_equal((UA_NodeId *)local_90,
                                (UA_NodeId *)((long)&serviceFaultNodeId.identifier + 8));
        if (UVar2) {
          expectedNodeId.identifier._12_4_ =
               UA_decodeBinary(message,(size_t *)responseId.identifier.guid.data4,rd->response,
                               rd->responseType);
        }
        else {
          UVar2 = UA_NodeId_equal((UA_NodeId *)local_90,(UA_NodeId *)&respHeader);
          if (UVar2) {
            expectedNodeId.identifier._12_4_ =
                 UA_decodeBinary(message,(size_t *)responseId.identifier.guid.data4,rd->response,
                                 UA_TYPES + 0x90);
          }
          else {
            UA_LOG_ERROR((rd->client->config).logger,UA_LOGCATEGORY_CLIENT,
                         "Reply answers the wrong request. Expected ns=%i,i=%i.But retrieved ns=%i,i=%i"
                         ,(ulong)(ushort)serviceFaultNodeId.identifier._8_2_,
                         (ulong)(uint)expectedNodeId._0_4_,(ulong)(ushort)local_90._0_2_,
                         responseId._0_4_);
            UA_NodeId_deleteMembers((UA_NodeId *)local_90);
            expectedNodeId.identifier._12_4_ = 0x80020000;
          }
        }
      }
    }
    else {
      UA_LOG_ERROR((rd->client->config).logger,UA_LOGCATEGORY_CLIENT,
                   "Reply answers the wrong requestId. Async services are not yet implemented.");
      expectedNodeId.identifier._12_4_ = 0x80020000;
    }
  }
  else {
    UA_LOG_ERROR((rd->client->config).logger,UA_LOGCATEGORY_CLIENT,
                 "Server replied with the wrong message type");
    expectedNodeId.identifier._12_4_ = 0x807e0000;
  }
  if (expectedNodeId.identifier._12_4_ == 0) {
    UA_LOG_DEBUG((rd->client->config).logger,UA_LOGCATEGORY_CLIENT,"Received a response of type %i",
                 (ulong)(uint)responseId._0_4_);
  }
  else {
    if (expectedNodeId.identifier._12_4_ == -0x7ff80000) {
      expectedNodeId.identifier._12_4_ = 0x80b90000;
    }
    UA_LOG_INFO((rd->client->config).logger,UA_LOGCATEGORY_CLIENT,"Error receiving the response");
    *(undefined4 *)((long)pvVar1 + 0xc) = expectedNodeId.identifier._12_4_;
  }
  return;
}

Assistant:

static void
processServiceResponse(struct ResponseDescription *rd, UA_SecureChannel *channel,
                       UA_MessageType messageType, UA_UInt32 requestId,
                       UA_ByteString *message) {
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    const UA_NodeId expectedNodeId =
        UA_NODEID_NUMERIC(0, rd->responseType->binaryEncodingId);
    const UA_NodeId serviceFaultNodeId =
        UA_NODEID_NUMERIC(0, UA_TYPES[UA_TYPES_SERVICEFAULT].binaryEncodingId);

    UA_ResponseHeader *respHeader = (UA_ResponseHeader*)rd->response;
    rd->processed = true;

    if(messageType == UA_MESSAGETYPE_ERR) {
        UA_TcpErrorMessage *msg = (UA_TcpErrorMessage*)message;
        UA_LOG_ERROR(rd->client->config.logger, UA_LOGCATEGORY_CLIENT,
                     "Server replied with an error message: %s %.*s",
                     UA_StatusCode_name(msg->error), msg->reason.length, msg->reason.data);
        retval = msg->error;
        goto finish;
    } else if(messageType != UA_MESSAGETYPE_MSG) {
        UA_LOG_ERROR(rd->client->config.logger, UA_LOGCATEGORY_CLIENT,
                     "Server replied with the wrong message type");
        retval = UA_STATUSCODE_BADTCPMESSAGETYPEINVALID;
        goto finish;
    }

    /* Check that the request id matches */
    /* Todo: we need to demux async responses since a publish responses may come
       at any time */
    if(requestId != rd->requestId) {
        UA_LOG_ERROR(rd->client->config.logger, UA_LOGCATEGORY_CLIENT,
                     "Reply answers the wrong requestId. "
                     "Async services are not yet implemented.");
        retval = UA_STATUSCODE_BADINTERNALERROR;
        goto finish;
    }

    /* Check that the response type matches */
    size_t offset = 0;
    UA_NodeId responseId;
    retval = UA_NodeId_decodeBinary(message, &offset, &responseId);
    if(retval != UA_STATUSCODE_GOOD)
        goto finish;
    if(!UA_NodeId_equal(&responseId, &expectedNodeId)) {
        if(UA_NodeId_equal(&responseId, &serviceFaultNodeId)) {
            /* Take the statuscode from the servicefault */
            retval = UA_decodeBinary(message, &offset, rd->response,
                                     &UA_TYPES[UA_TYPES_SERVICEFAULT]);
        } else {
            UA_LOG_ERROR(rd->client->config.logger, UA_LOGCATEGORY_CLIENT,
                         "Reply answers the wrong request. Expected ns=%i,i=%i."
                         "But retrieved ns=%i,i=%i", expectedNodeId.namespaceIndex,
                         expectedNodeId.identifier.numeric, responseId.namespaceIndex,
                         responseId.identifier.numeric);
            UA_NodeId_deleteMembers(&responseId);
            retval = UA_STATUSCODE_BADINTERNALERROR;
        }
        goto finish;
    }

    /* Decode the response */
    retval = UA_decodeBinary(message, &offset, rd->response, rd->responseType);

 finish:
    if(retval == UA_STATUSCODE_GOOD) {
        UA_LOG_DEBUG(rd->client->config.logger, UA_LOGCATEGORY_CLIENT,
                     "Received a response of type %i", responseId.identifier.numeric);
    } else {
        if(retval == UA_STATUSCODE_BADENCODINGLIMITSEXCEEDED)
            retval = UA_STATUSCODE_BADRESPONSETOOLARGE;
        UA_LOG_INFO(rd->client->config.logger, UA_LOGCATEGORY_CLIENT,
                    "Error receiving the response");
        respHeader->serviceResult = retval;
    }
}